

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
::val(FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
      *this)

{
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar3;
  
  pFVar1 = (this->left_->fadexpr_).right_;
  pFVar2 = (pFVar1->fadexpr_).left_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  return ((((pFVar3->fadexpr_).left_)->val_ + ((pFVar3->fadexpr_).right_)->val_ +
          ((pFVar2->fadexpr_).right_)->val_) - (pFVar1->fadexpr_).right_.constant_) *
         (this->left_->fadexpr_).left_.constant_ -
         (this->right_->fadexpr_).left_.constant_ * ((this->right_->fadexpr_).right_)->val_;
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}